

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

void cnv_trap_obj(int otyp,int cnt,trap *ttmp)

{
  trap *ptVar1;
  uint uVar2;
  obj *obj;
  trap *ptVar3;
  trap *ptVar4;
  obj *unaff_RBX;
  
  obj = mksobj(level,otyp,'\x01','\0');
  obj->quan = cnt;
  uVar2 = weight(obj);
  obj->owt = uVar2;
  if (otyp - 9U < 0xfffffffe) {
    obj->field_0x4b = obj->field_0x4b & 0x7f;
  }
  place_object(obj,level,(int)ttmp->tx,(int)ttmp->ty);
  if ((char)ttmp->field_0x8 < '\0') {
    sellobj(obj,ttmp->tx,ttmp->ty);
  }
  stackobj(unaff_RBX);
  newsym((int)ttmp->tx,(int)ttmp->ty);
  ptVar1 = level->lev_traps;
  if (ptVar1 == ttmp) {
    ptVar3 = (trap *)&level->lev_traps;
    ptVar4 = ptVar1;
  }
  else {
    do {
      ptVar3 = ptVar1;
      ptVar4 = ttmp;
      ptVar1 = ptVar3->ntrap;
    } while (ptVar3->ntrap != ttmp);
  }
  ptVar3->ntrap = ptVar4->ntrap;
  free(ttmp);
  return;
}

Assistant:

static void cnv_trap_obj(int otyp, int cnt, struct trap *ttmp)
{
	struct obj *otmp = mksobj(level, otyp, TRUE, FALSE);
	otmp->quan=cnt;
	otmp->owt = weight(otmp);
	/* Only dart and shuriken traps are capable of being poisonous */
	if (otyp != DART && otyp != SHURIKEN)
	    otmp->opoisoned = 0;
	place_object(otmp, level, ttmp->tx, ttmp->ty);
	/* Sell your own traps only... */
	if (ttmp->madeby_u) sellobj(otmp, ttmp->tx, ttmp->ty);
	stackobj(otmp);
	newsym(ttmp->tx, ttmp->ty);
	deltrap(level, ttmp);
}